

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O0

exr_result_t
internal_exr_undo_dwab
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  size_t newsz;
  long in_RDI;
  undefined8 in_R8;
  DwaCompressor dwab;
  exr_result_t rv;
  uint64_t in_stack_000001b8;
  void *in_stack_000001c0;
  uint64_t in_stack_000001c8;
  uint8_t *in_stack_000001d0;
  DwaCompressor *in_stack_000001d8;
  DwaCompressor *in_stack_ffffffffffffff00;
  void **in_stack_ffffffffffffff08;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff14;
  exr_decode_pipeline_t *in_stack_ffffffffffffff18;
  exr_decode_pipeline_t *in_stack_ffffffffffffff30;
  exr_encode_pipeline_t *in_stack_ffffffffffffff38;
  AcCompression in_stack_ffffffffffffff44;
  DwaCompressor *in_stack_ffffffffffffff48;
  undefined4 local_2c;
  
  newsz = in_RDI + 0xc0;
  internal_exr_huf_decompress_spare_bytes();
  local_2c = internal_decode_alloc_buffer
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                        in_stack_ffffffffffffff08,(size_t *)in_stack_ffffffffffffff00,newsz);
  if (local_2c == 0) {
    local_2c = DwaCompressor_construct
                         (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (local_2c == 0) {
      local_2c = DwaCompressor_uncompress
                           (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                            in_stack_000001b8);
    }
    DwaCompressor_destroy(in_stack_ffffffffffffff00);
  }
  *(undefined8 *)(in_RDI + 0x68) = in_R8;
  return local_2c;
}

Assistant:

exr_result_t
internal_exr_undo_dwab (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t  rv;
    DwaCompressor dwab;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        internal_exr_huf_decompress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwab, STATIC_HUFFMAN, NULL, decode);
        if (rv == EXR_ERR_SUCCESS)
            rv = DwaCompressor_uncompress (
                &dwab,
                compressed_data,
                comp_buf_size,
                uncompressed_data,
                uncompressed_size);

        DwaCompressor_destroy (&dwab);
    }
    decode->bytes_decompressed = uncompressed_size;

    return rv;
}